

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.c
# Opt level: O2

int repeat_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  uint uVar1;
  repeat_segment_data *data;
  int iVar2;
  code *pcVar3;
  float fVar4;
  float fVar5;
  
  if (field == 1) {
    if (*value == '\x01') {
      pcVar3 = repeat_segment_mix_bypass;
    }
    else {
      pcVar3 = repeat_segment_mix;
    }
    segment->mix = pcVar3;
    return 1;
  }
  data = (repeat_segment_data *)segment->data;
  if (field == 0x38) {
    if (0.0 <= *value) {
      uVar1 = data->buffer_size;
      fVar4 = ceilf(*value * (float)data->samplerate);
      if ((uint)(long)fVar4 < uVar1) {
        data->buffer_index = (uint)(long)fVar4;
        return 1;
      }
    }
  }
  else if (field == 0x1e) {
    fVar4 = *value;
    if (0.0 < fVar4) {
      fVar5 = ceilf((float)data->samplerate * fVar4);
      iVar2 = repeat_segment_data_resize_buffer(data,(uint32_t)(long)fVar5);
      if (iVar2 == 0) {
        return 0;
      }
      data->time = fVar4;
      return 1;
    }
  }
  else if (field == 0x1f) {
    if (*value - MIXED_RECORD < 3) {
      data->mode = *value;
      return 1;
    }
  }
  else {
    if (field != 2) {
      iVar2 = 7;
      goto LAB_0013eb7a;
    }
    uVar1 = *value;
    if (uVar1 != 0) {
      fVar4 = ceilf((float)uVar1 * data->time);
      iVar2 = repeat_segment_data_resize_buffer(data,(uint32_t)(long)fVar4);
      if (iVar2 != 0) {
        data->samplerate = uVar1;
        return 1;
      }
      return 0;
    }
  }
  iVar2 = 8;
LAB_0013eb7a:
  mixed_err(iVar2);
  return 0;
}

Assistant:

int repeat_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct repeat_segment_data *data = (struct repeat_segment_data *)segment->data;
  switch(field){
  case MIXED_SAMPLERATE:
    if(*(uint32_t *)value <= 0){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    uint32_t samplerate = *(uint32_t *)value;
    if (!repeat_segment_data_resize_buffer(data, ceil(samplerate * data->time))){
      return 0;
    }
    data->samplerate = samplerate;
    break;
  case MIXED_REPEAT_TIME:
    if(*(float *)value <= 0.0f){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    float time = *(float *)value;
    if (!repeat_segment_data_resize_buffer(data, ceil(data->samplerate * time))){
      return 0;
    }
    data->time = time;
    break;
  case MIXED_REPEAT_MODE:
    if(*(enum mixed_repeat_mode *)value != MIXED_RECORD &&
       *(enum mixed_repeat_mode *)value != MIXED_PLAY &&
       *(enum mixed_repeat_mode *)value != MIXED_RECORD_ONCE){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->mode = *(enum mixed_repeat_mode *)value;
    break;
  case MIXED_REPEAT_POSITION: {
    float position = (*(float *)value);
    if(position < 0.0f){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    uint32_t index = ceil(position * data->samplerate);
    if(index >= data->buffer_size){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->buffer_index = index;
    break;
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = repeat_segment_mix_bypass;
    }else{
      segment->mix = repeat_segment_mix;
    }
    break;}
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}